

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPController.cpp
# Opt level: O0

void __thiscall cppti::HTTPController::routeTalks(HTTPController *this,Request *req,Response *res)

{
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,__1L> filtertags;
  string_view speaker_00;
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  TalksDB *this_00;
  char *pcVar4;
  string_view sVar5;
  undefined1 auVar6 [16];
  int local_1dc;
  string_t local_178;
  undefined1 local_158 [8];
  json json;
  pointer peStack_140;
  vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
  local_118;
  vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
  *local_100;
  vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
  *talks;
  undefined4 local_f0;
  int year;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  string rawyear;
  undefined1 local_a8 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  tags;
  string raw_tags;
  undefined1 local_60 [8];
  string conference;
  string speaker;
  Response *res_local;
  Request *req_local;
  HTTPController *this_local;
  
  httplib::Request::get_param_value_abi_cxx11_
            ((string *)((long)&conference.field_2 + 8),req,"speaker",0);
  httplib::Request::get_param_value_abi_cxx11_((string *)local_60,req,"conference",0);
  pcVar4 = (char *)0x0;
  httplib::Request::get_param_value_abi_cxx11_
            ((string *)
             &tags.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,req,"tags",0);
  auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view
                     ((string *)
                      &tags.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar5._M_len = auVar6._8_8_;
  rawyear.field_2._8_8_ = auVar6._0_8_;
  sVar5._M_str = pcVar4;
  anon_unknown_2::splitTags
            ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)local_a8,(anon_unknown_2 *)rawyear.field_2._8_8_,sVar5);
  httplib::Request::get_param_value_abi_cxx11_((string *)local_d8,req,"year",0);
  poVar2 = std::operator<<((ostream *)&std::cout,"speaker=\'");
  poVar2 = std::operator<<(poVar2,(string *)(conference.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,"\', conference=\'");
  poVar2 = std::operator<<(poVar2,(string *)local_60);
  poVar2 = std::operator<<(poVar2,"\', tags=\'");
  poVar2 = std::operator<<(poVar2,(string *)
                                  &tags.
                                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar2 = std::operator<<(poVar2,"\', year=");
  poVar2 = std::operator<<(poVar2,(string *)local_d8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_e0 = std::__cxx11::string::begin();
  local_e8 = std::__cxx11::string::end();
  bVar1 = std::
          all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,cppti::HTTPController::routeTalks(httplib::Request_const&,httplib::Response&)::__0>
                    (local_e0,local_e8);
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      local_1dc = std::__cxx11::stoi((string *)local_d8,(size_t *)0x0,10);
    }
    else {
      local_1dc = 0;
    }
    talks._4_4_ = local_1dc;
    this_00 = std::reference_wrapper<const_cppti::TalksDB>::get(&this->talksdb);
    speaker_00 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)(conference.field_2._M_local_buf + 8));
    sVar5 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    gsl::span<std::basic_string_view<char,std::char_traits<char>>const,-1l>::
    span<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,void>
              ((span<std::basic_string_view<char,std::char_traits<char>>const,_1l> *)
               &json.m_value.boolean,
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)local_a8);
    filtertags.storage_.data_ = peStack_140;
    filtertags.storage_.super_extent_type<_1L>.size_ = (index_type)json.m_value.object;
    TalksDB::get(&local_118,this_00,speaker_00,sVar5,filtertags,(long)talks._4_4_,0x32);
    local_100 = &local_118;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_&,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_158,local_100);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump(&local_178,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)local_158,-1,' ',false,strict);
    httplib::Response::set_content(res,&local_178,"application/json");
    std::__cxx11::string::~string((string *)&local_178);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_158);
    std::
    vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
    ::~vector(&local_118);
    local_f0 = 0;
  }
  else {
    local_f0 = 1;
  }
  std::__cxx11::string::~string((string *)local_d8);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_a8);
  std::__cxx11::string::~string
            ((string *)
             &tags.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(conference.field_2._M_local_buf + 8));
  return;
}

Assistant:

void HTTPController::routeTalks(Request const& req, Response& res)
{
  auto const speaker = req.get_param_value("speaker");
  auto const conference = req.get_param_value("conference");
  auto const raw_tags = req.get_param_value("tags");
  auto const tags = splitTags(raw_tags);
  auto const rawyear = req.get_param_value("year");
  std::cout << "speaker='" << speaker << "', conference='" << conference
            << "', tags='" << raw_tags << "', year=" << rawyear << std::endl;
  if (!std::all_of(rawyear.begin(), rawyear.end(), [&](char c) {
        return std::isdigit(c);
      }))
    return;
  auto const year = rawyear.empty() ? 0 : std::stoi(rawyear);
  auto const& talks = this->talksdb.get().get(speaker, conference, tags, year);

  nlohmann::json const json = talks;
  res.set_content(json.dump(), "application/json");
}